

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

vector<float,_std::allocator<float>_> *
deqp::gles31::Functional::anon_unknown_1::PrimitiveDiscardCase::genAttributes(void)

{
  int iVar1;
  vector<float,_std::allocator<float>_> *in_RDI;
  float local_dc;
  float local_c4;
  float local_c0;
  float local_bc;
  float local_b8;
  int local_b4;
  int local_b0;
  int row;
  int col;
  int j;
  int i [6];
  int index;
  int numRows;
  int local_74;
  int numCols;
  int choiceNdx;
  int levelNdx;
  float choices [6] [3];
  int numChoices;
  vector<float,_std::allocator<float>_> *result;
  
  std::vector<float,_std::allocator<float>_>::vector(in_RDI);
  for (numCols = 0; numCols < 6; numCols = numCols + 1) {
    for (local_74 = 0; local_74 < 3; local_74 = local_74 + 1) {
      if (local_74 == 0) {
        local_dc = genAttributes::baseTessLevels[numCols];
      }
      else {
        local_dc = genAttributes::invalidTessLevelChoices[local_74 + -1];
      }
      (&levelNdx)[(long)numCols * 3 + (long)local_74] = (int)local_dc;
    }
  }
  iVar1 = intPow(3,3);
  i[5] = 0;
  for (i[0] = 0; i[0] < 3; i[0] = i[0] + 1) {
    for (i[1] = 0; i[1] < 3; i[1] = i[1] + 1) {
      for (i[2] = 0; i[2] < 3; i[2] = i[2] + 1) {
        for (i[3] = 0; i[3] < 3; i[3] = i[3] + 1) {
          for (col = 0; col < 3; col = col + 1) {
            for (j = 0; j < 3; j = j + 1) {
              for (row = 0; row < 6; row = row + 1) {
                std::vector<float,_std::allocator<float>_>::push_back
                          (in_RDI,(value_type_conflict2 *)
                                  (&levelNdx + (long)row * 3 + (long)(&col)[row]));
              }
              local_b0 = i[5] % iVar1;
              local_b4 = i[5] / iVar1;
              local_b8 = 2.0 / (float)iVar1;
              std::vector<float,_std::allocator<float>_>::push_back(in_RDI,&local_b8);
              local_bc = 2.0 / (float)iVar1;
              std::vector<float,_std::allocator<float>_>::push_back(in_RDI,&local_bc);
              local_c0 = (float)local_b0 / (float)iVar1 + (float)local_b0 / (float)iVar1 + -1.0;
              std::vector<float,_std::allocator<float>_>::push_back(in_RDI,&local_c0);
              local_c4 = (float)local_b4 / (float)iVar1 + (float)local_b4 / (float)iVar1 + -1.0;
              std::vector<float,_std::allocator<float>_>::push_back(in_RDI,&local_c4);
              i[5] = i[5] + 1;
            }
          }
        }
      }
    }
  }
  return in_RDI;
}

Assistant:

vector<float> PrimitiveDiscardCase::genAttributes (void)
{
	// Generate input attributes (tessellation levels, and position scale and
	// offset) for a number of primitives. Each primitive has a different
	// combination of tessellatio levels; each level is either a valid
	// value or an "invalid" value (negative or zero, chosen from
	// invalidTessLevelChoices).

	// \note The attributes are generated in such an order that all of the
	//		 valid attribute tuples come before the first invalid one both
	//		 in the result vector, and when scanning the resulting 2d grid
	//		 of primitives is scanned in y-major order. This makes
	//		 verification somewhat simpler.

	static const float	baseTessLevels[6]			= { 3.0f, 4.0f, 5.0f, 6.0f, 7.0f, 8.0f };
	static const float	invalidTessLevelChoices[]	= { -0.42f, 0.0f };
	const int			numChoices					= 1 + DE_LENGTH_OF_ARRAY(invalidTessLevelChoices);
	float				choices[6][numChoices];
	vector<float>		result;

	for (int levelNdx = 0; levelNdx < 6; levelNdx++)
		for (int choiceNdx = 0; choiceNdx < numChoices; choiceNdx++)
			choices[levelNdx][choiceNdx] = choiceNdx == 0 ? baseTessLevels[levelNdx] : invalidTessLevelChoices[choiceNdx-1];

	{
		const int	numCols			= intPow(numChoices, 6/2); // sqrt(numChoices**6) == sqrt(number of primitives)
		const int	numRows			= numCols;
		int			index			= 0;
		int			i[6];
		// We could do this with some generic combination-generation function, but meh, it's not that bad.
		for (i[2] = 0; i[2] < numChoices; i[2]++) // First  outer
		for (i[3] = 0; i[3] < numChoices; i[3]++) // Second outer
		for (i[4] = 0; i[4] < numChoices; i[4]++) // Third  outer
		for (i[5] = 0; i[5] < numChoices; i[5]++) // Fourth outer
		for (i[0] = 0; i[0] < numChoices; i[0]++) // First  inner
		for (i[1] = 0; i[1] < numChoices; i[1]++) // Second inner
		{
			for (int j = 0; j < 6; j++)
				result.push_back(choices[j][i[j]]);

			{
				const int col = index % numCols;
				const int row = index / numCols;
				// Position scale.
				result.push_back((float)2.0f / (float)numCols);
				result.push_back((float)2.0f / (float)numRows);
				// Position offset.
				result.push_back((float)col / (float)numCols * 2.0f - 1.0f);
				result.push_back((float)row / (float)numRows * 2.0f - 1.0f);
			}

			index++;
		}
	}

	return result;
}